

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

SSTableIndex * __thiscall SSTable::getIndex(SSTable *this)

{
  SSTableHeader *pSVar1;
  SSTableIndex *pSVar2;
  SSTableIndexItem temp;
  ifstream in;
  byte abStack_200 [488];
  
  pSVar2 = this->index;
  if (pSVar2 == (SSTableIndex *)0x0) {
    pSVar1 = getHeader(this);
    create_binary_ifstream((path *)&in);
    std::istream::seekg((path *)&in,pSVar1->index_offset,0);
    pSVar2 = (SSTableIndex *)operator_new(0x18);
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->index = pSVar2;
    temp.key = 0;
    temp.offset = 0;
    while( true ) {
      operator>>((istream *)&in,&temp);
      if ((abStack_200[*(long *)(_in + -0x18)] & 5) != 0) break;
      std::vector<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>::push_back(this->index,&temp)
      ;
    }
    std::ifstream::~ifstream(&in);
    pSVar2 = this->index;
  }
  return pSVar2;
}

Assistant:

SSTableIndex *SSTable::getIndex() {
    if (index == nullptr) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(h->index_offset);
        index = new SSTableIndex{};
        auto temp = SSTableIndexItem{};
        while (in >> temp) {
            index->push_back(temp);
        }
    }
    return index;
}